

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory,
          mode_t *default_dir_mode)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int __errnum;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference this_00;
  reference origName;
  ulong uVar7;
  bool collapse;
  string local_1ab8 [32];
  undefined1 local_1a98 [8];
  ostringstream cmCPackLog_msg_13;
  string local_1920 [32];
  undefined1 local_1900 [8];
  ostringstream cmCPackLog_msg_12;
  string local_1788 [32];
  undefined1 local_1768 [8];
  ostringstream cmCPackLog_msg_11;
  undefined1 local_15f0 [8];
  string destDir;
  undefined1 local_15b0 [8];
  ostringstream cmCPackLog_msg_10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *symlinked;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4_1;
  undefined1 local_13f8 [8];
  ostringstream cmCPackLog_msg_9;
  undefined1 local_1280 [8];
  cmWorkingDirectory workdir;
  undefined1 local_1238 [8];
  ostringstream cmCPackLog_msg_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  undefined1 local_10a0 [8];
  string goToDir;
  string curDir;
  undefined1 local_1040 [8];
  ostringstream cmCPackLog_msg_7;
  undefined1 local_ec8 [8];
  string inFileRelative;
  string targetFile;
  undefined1 local_e68 [8];
  ostringstream cmCPackLog_msg_6;
  string local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  undefined1 local_c70 [8];
  string filePath;
  undefined1 local_c30 [8];
  ostringstream cmCPackLog_msg_5;
  RegularExpression *reg;
  iterator __end4;
  iterator __begin4;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range4;
  string inFile;
  bool skip;
  string *gf;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_a30 [8];
  ostringstream cmCPackLog_msg_4;
  string local_8b8 [32];
  undefined1 local_898 [8];
  ostringstream cmCPackLog_msg_3;
  undefined1 local_720 [8];
  string findExpr;
  string subdir;
  undefined1 local_6d8 [8];
  string top;
  Glob gl;
  undefined1 local_640 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_4c8 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  string *tempDir;
  iterator it;
  string local_488 [32];
  undefined1 local_468 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_2e9;
  string local_2e8;
  undefined1 local_2c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  string local_2a8;
  char *local_288;
  char *installDirectories;
  undefined1 local_260 [8];
  ostringstream cmCPackLog_msg;
  string *ifr;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_c0;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  allocator<char> local_71;
  string local_70;
  char *local_50;
  char *cpackIgnoreFiles;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  mode_t *default_dir_mode_local;
  string *tempInstallDirectory_local;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)default_dir_mode;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
             &cpackIgnoreFiles);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CPACK_IGNORE_FILES",&local_71);
  pcVar3 = GetOption(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_50 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0);
    pcVar3 = local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,pcVar3,(allocator<char> *)((long)&__range2 + 7));
    cmSystemTools::ExpandListArgument
              (&local_c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,false);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a0);
    ifr = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a0);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&ifr), bVar2) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      poVar5 = std::operator<<((ostream *)local_260,"Create ignore files regex for: ");
      poVar5 = std::operator<<(poVar5,(string *)pbVar6);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x13e,pcVar3);
      std::__cxx11::string::~string((string *)&installDirectories);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
      std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                 &cpackIgnoreFiles,pbVar6);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"CPACK_INSTALLED_DIRECTORIES",
             (allocator<char> *)
             ((long)&installDirectoriesVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = GetOption(this,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&installDirectoriesVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_288 = pcVar3;
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    pcVar3 = local_288;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar3,&local_2e9);
    cmSystemTools::ExpandListArgument
              (&local_2e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2c8,false);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c8);
    if ((sVar4 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&tempDir);
      tempDir = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2c8);
      while( true ) {
        symlinkedFiles.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&tempDir,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&symlinkedFiles.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) break;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_4c8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
        poVar5 = std::operator<<((ostream *)local_640,"Find files");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x156,pcVar3);
        std::__cxx11::string::~string((string *)&gl.ListDirs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
        cmsys::Glob::Glob((Glob *)((long)&top.field_2 + 8));
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&tempDir);
        std::__cxx11::string::string((string *)local_6d8,(string *)pbVar6);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&tempDir,0);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&tempDir);
        std::__cxx11::string::string((string *)(findExpr.field_2._M_local_buf + 8),(string *)pbVar6)
        ;
        std::__cxx11::string::string((string *)local_720,(string *)local_6d8);
        std::__cxx11::string::operator+=((string *)local_720,"/*");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
        poVar5 = std::operator<<((ostream *)local_898,"- Install directory: ");
        poVar5 = std::operator<<(poVar5,(string *)local_6d8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x15e,pcVar3);
        std::__cxx11::string::~string(local_8b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
        cmsys::Glob::RecurseOn((Glob *)((long)&top.field_2 + 8));
        cmsys::Glob::SetRecurseListDirs((Glob *)((long)&top.field_2 + 8),true);
        bVar2 = cmsys::Glob::FindFiles
                          ((Glob *)((long)&top.field_2 + 8),(string *)local_720,(GlobMessages *)0x0)
        ;
        if (bVar2) {
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&top.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->files,__x);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->files);
          gf = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->files);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&gf), bVar2) {
            pbVar6 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end3);
            inFile.field_2._M_local_buf[0xf] = '\0';
            std::__cxx11::string::string((string *)&__range4,(string *)pbVar6);
            bVar2 = cmsys::SystemTools::FileIsDirectory(pbVar6);
            if (bVar2) {
              std::__cxx11::string::operator+=((string *)&__range4,'/');
            }
            __end4 = std::
                     vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                     begin((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                            *)&cpackIgnoreFiles);
            reg = (RegularExpression *)
                  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                  end((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *
                      )&cpackIgnoreFiles);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                               *)&reg), bVar2) {
              this_00 = __gnu_cxx::
                        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                        ::operator*(&__end4);
              bVar2 = cmsys::RegularExpression::find(this_00,(string *)&__range4);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c30);
                poVar5 = std::operator<<((ostream *)local_c30,"Ignore file: ");
                poVar5 = std::operator<<(poVar5,(string *)&__range4);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,2,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x171,pcVar3);
                std::__cxx11::string::~string((string *)(filePath.field_2._M_local_buf + 8));
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c30);
                inFile.field_2._M_local_buf[0xf] = '\x01';
              }
              __gnu_cxx::
              __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
              ::operator++(&__end4);
            }
            if ((inFile.field_2._M_local_buf[0xf] & 1U) == 0) {
              std::__cxx11::string::string((string *)local_c70,(string *)tempInstallDirectory);
              std::operator+(&local_cd0,"/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&findExpr.field_2 + 8));
              std::operator+(&local_cb0,&local_cd0,"/");
              cmSystemTools::RelativePath(&local_cf0,(string *)local_6d8,pbVar6);
              std::operator+(&local_c90,&local_cb0,&local_cf0);
              std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_c90);
              std::__cxx11::string::~string((string *)&local_c90);
              std::__cxx11::string::~string((string *)&local_cf0);
              std::__cxx11::string::~string((string *)&local_cb0);
              std::__cxx11::string::~string((string *)&local_cd0);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e68);
              poVar5 = std::operator<<((ostream *)local_e68,"Copy file: ");
              poVar5 = std::operator<<(poVar5,(string *)&__range4);
              poVar5 = std::operator<<(poVar5," -> ");
              poVar5 = std::operator<<(poVar5,(string *)local_c70);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar3 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x17c,pcVar3);
              std::__cxx11::string::~string((string *)(targetFile.field_2._M_local_buf + 8));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e68);
              bVar2 = cmsys::SystemTools::FileIsSymlink((string *)&__range4);
              if (bVar2) {
                std::__cxx11::string::string((string *)(inFileRelative.field_2._M_local_buf + 8));
                cmSystemTools::RelativePath
                          ((string *)local_ec8,(string *)local_6d8,(string *)&__range4);
                cmsys::SystemTools::ReadSymlink
                          ((string *)&__range4,(string *)((long)&inFileRelative.field_2 + 8));
                std::
                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                            *)local_4c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&inFileRelative.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_ec8);
                std::__cxx11::string::~string((string *)local_ec8);
                std::__cxx11::string::~string((string *)(inFileRelative.field_2._M_local_buf + 8));
LAB_00153545:
                it._M_current._4_4_ = 0;
              }
              else {
                bVar2 = cmsys::SystemTools::CopyFileIfDifferent
                                  ((string *)&__range4,(string *)local_c70);
                if ((bVar2) &&
                   (bVar2 = cmFileTimes::Copy((string *)&__range4,(string *)local_c70), bVar2))
                goto LAB_00153545;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1040);
                poVar5 = std::operator<<((ostream *)local_1040,"Problem copying file: ");
                poVar5 = std::operator<<(poVar5,(string *)&__range4);
                poVar5 = std::operator<<(poVar5," -> ");
                poVar5 = std::operator<<(poVar5,(string *)local_c70);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x18b,pcVar3);
                std::__cxx11::string::~string((string *)(curDir.field_2._M_local_buf + 8));
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1040);
                this_local._4_4_ = 0;
                it._M_current._4_4_ = 1;
              }
              std::__cxx11::string::~string((string *)local_c70);
            }
            else {
              it._M_current._4_4_ = 0x12;
            }
            std::__cxx11::string::~string((string *)&__range4);
            if ((it._M_current._4_4_ != 0) && (it._M_current._4_4_ != 0x12)) goto LAB_00153fea;
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          bVar2 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_4c8);
          if (!bVar2) {
            cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                      ((string *)((long)&goToDir.field_2 + 8),(SystemTools *)0x1,collapse);
            std::__cxx11::string::string((string *)local_10a0,(string *)tempInstallDirectory);
            std::operator+(&local_10c0,"/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&findExpr.field_2 + 8));
            std::__cxx11::string::operator+=((string *)local_10a0,(string *)&local_10c0);
            std::__cxx11::string::~string((string *)&local_10c0);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1238);
            poVar5 = std::operator<<((ostream *)local_1238,"Change dir to: ");
            poVar5 = std::operator<<(poVar5,(string *)local_10a0);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x195,pcVar3);
            std::__cxx11::string::~string((string *)&workdir.ResultCode);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1238);
            cmWorkingDirectory::cmWorkingDirectory
                      ((cmWorkingDirectory *)local_1280,(string *)local_10a0);
            bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_1280);
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13f8);
              poVar5 = std::operator<<((ostream *)local_13f8,
                                       "Failed to change working directory to ");
              poVar5 = std::operator<<(poVar5,(string *)local_10a0);
              poVar5 = std::operator<<(poVar5," : ");
              __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_1280);
              pcVar3 = strerror(__errnum);
              poVar5 = std::operator<<(poVar5,pcVar3);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar3 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x19c,pcVar3);
              std::__cxx11::string::~string((string *)&__range4_1);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13f8);
              this_local._4_4_ = 0;
              it._M_current._4_4_ = 1;
            }
            else {
              __end4_1 = std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_4c8);
              symlinked = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)std::
                             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_4c8);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end4_1,
                                        (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)&symlinked), bVar2) {
                origName = __gnu_cxx::
                           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::operator*(&__end4_1);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_15b0);
                poVar5 = std::operator<<((ostream *)local_15b0,"Will create a symlink: ");
                poVar5 = std::operator<<(poVar5,(string *)&origName->second);
                poVar5 = std::operator<<(poVar5,"--> ");
                poVar5 = std::operator<<(poVar5,(string *)origName);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,4,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1a3,pcVar3);
                std::__cxx11::string::~string((string *)(destDir.field_2._M_local_buf + 8));
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_15b0);
                cmsys::SystemTools::GetFilenamePath((string *)local_15f0,&origName->second);
                uVar7 = std::__cxx11::string::empty();
                if (((uVar7 & 1) == 0) &&
                   (bVar2 = cmsys::SystemTools::MakeDirectory
                                      ((string *)local_15f0,
                                       (mode_t *)
                                       ignoreFilesRegex.
                                       super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar2))
                {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1768);
                  poVar5 = std::operator<<((ostream *)local_1768,"Cannot create dir: ");
                  poVar5 = std::operator<<(poVar5,(string *)local_15f0);
                  poVar5 = std::operator<<(poVar5,"\nTrying to create symlink: ");
                  poVar5 = std::operator<<(poVar5,(string *)&origName->second);
                  poVar5 = std::operator<<(poVar5,"--> ");
                  poVar5 = std::operator<<(poVar5,(string *)origName);
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  pcVar1 = this->Logger;
                  std::__cxx11::ostringstream::str();
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  cmCPackLog::Log(pcVar1,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x1ad,pcVar3);
                  std::__cxx11::string::~string(local_1788);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1768);
                }
                bVar2 = cmSystemTools::CreateSymlink
                                  (&origName->first,&origName->second,(string *)0x0);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1900);
                  poVar5 = std::operator<<((ostream *)local_1900,"Cannot create symlink: ");
                  poVar5 = std::operator<<(poVar5,(string *)&origName->second);
                  poVar5 = std::operator<<(poVar5,"--> ");
                  poVar5 = std::operator<<(poVar5,(string *)origName);
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  pcVar1 = this->Logger;
                  std::__cxx11::ostringstream::str();
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  cmCPackLog::Log(pcVar1,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x1b4,pcVar3);
                  std::__cxx11::string::~string(local_1920);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1900);
                  this_local._4_4_ = 0;
                }
                it._M_current._5_3_ = 0;
                it._M_current._4_1_ = !bVar2;
                std::__cxx11::string::~string((string *)local_15f0);
                if (it._M_current._4_4_ != 0) goto LAB_00153f56;
                __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator++(&__end4_1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a98);
              poVar5 = std::operator<<((ostream *)local_1a98,"Going back to: ");
              poVar5 = std::operator<<(poVar5,(string *)(goToDir.field_2._M_local_buf + 8));
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar3 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1b9,pcVar3);
              std::__cxx11::string::~string(local_1ab8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a98);
              it._M_current._4_4_ = 0;
            }
LAB_00153f56:
            cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1280);
            std::__cxx11::string::~string((string *)local_10a0);
            std::__cxx11::string::~string((string *)(goToDir.field_2._M_local_buf + 8));
            if (it._M_current._4_4_ != 0) goto LAB_00153fea;
          }
          it._M_current._4_4_ = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a30);
          poVar5 = std::operator<<((ostream *)local_a30,
                                   "Cannot find any files in the installed directory");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x164,pcVar3);
          std::__cxx11::string::~string((string *)&__range3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a30);
          this_local._4_4_ = 0;
          it._M_current._4_4_ = 1;
        }
LAB_00153fea:
        std::__cxx11::string::~string((string *)local_720);
        std::__cxx11::string::~string((string *)(findExpr.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_6d8);
        cmsys::Glob::~Glob((Glob *)((long)&top.field_2 + 8));
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_4c8);
        if (it._M_current._4_4_ != 0) goto LAB_0015408d;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&tempDir);
      }
      it._M_current._4_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
      poVar5 = std::operator<<((ostream *)local_468,
                               "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x14e,pcVar3);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
      this_local._4_4_ = 0;
      it._M_current._4_4_ = 1;
    }
LAB_0015408d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
    if (it._M_current._4_4_ != 0) goto LAB_001540c6;
  }
  this_local._4_4_ = 1;
  it._M_current._4_4_ = 1;
LAB_001540c6:
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
             &cpackIgnoreFiles);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory,
  const mode_t* default_dir_mode)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if (cpackIgnoreFiles) {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    for (std::string const& ifr : ignoreFilesRegexString) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Create ignore files regex for: " << ifr << std::endl);
      ignoreFilesRegex.emplace_back(ifr);
    }
  }
  const char* installDirectories =
    this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if (installDirectories && *installDirectories) {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
                                      installDirectoriesVector);
    if (installDirectoriesVector.size() % 2 != 0) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation."
          << std::endl);
      return 0;
    }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for (it = installDirectoriesVector.begin();
         it != installDirectoriesVector.end(); ++it) {
      std::vector<std::pair<std::string, std::string>> symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if (!gl.FindFiles(findExpr)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot find any files in the installed directory"
                        << std::endl);
        return 0;
      }
      files = gl.GetFiles();
      for (std::string const& gf : files) {
        bool skip = false;
        std::string inFile = gf;
        if (cmSystemTools::FileIsDirectory(gf)) {
          inFile += '/';
        }
        for (cmsys::RegularExpression& reg : ignoreFilesRegex) {
          if (reg.find(inFile)) {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                          "Ignore file: " << inFile << std::endl);
            skip = true;
          }
        }
        if (skip) {
          continue;
        }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/" + cmSystemTools::RelativePath(top, gf);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Copy file: " << inFile << " -> " << filePath
                                    << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if (cmSystemTools::FileIsSymlink(inFile)) {
          std::string targetFile;
          std::string inFileRelative =
            cmSystemTools::RelativePath(top, inFile);
          cmSystemTools::ReadSymlink(inFile, targetFile);
          symlinkedFiles.emplace_back(std::move(targetFile),
                                      std::move(inFileRelative));
        }
        /* If it is not a symlink then do a plain copy */
        else if (!(cmSystemTools::CopyFileIfDifferent(inFile, filePath) &&
                   cmFileTimes::Copy(inFile, filePath))) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Problem copying file: " << inFile << " -> "
                                                 << filePath << std::endl);
          return 0;
        }
      }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty()) {
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir += "/" + subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir << std::endl);
        cmWorkingDirectory workdir(goToDir);
        if (workdir.Failed()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Failed to change working directory to "
                          << goToDir << " : "
                          << std::strerror(workdir.GetLastResult())
                          << std::endl);
          return 0;
        }
        for (auto const& symlinked : symlinkedFiles) {
          cmCPackLogger(cmCPackLog::LOG_DEBUG,
                        "Will create a symlink: " << symlinked.second << "--> "
                                                  << symlinked.first
                                                  << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinked.second);
          if (!destDir.empty() &&
              !cmSystemTools::MakeDirectory(destDir, default_dir_mode)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create dir: "
                            << destDir << "\nTrying to create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
          }
          if (!cmSystemTools::CreateSymlink(symlinked.first,
                                            symlinked.second)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
            return 0;
          }
        }
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Going back to: " << curDir << std::endl);
      }
    }
  }
  return 1;
}